

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O3

void __thiscall
ManySubcommands_Required1Fuzzy_Test::~ManySubcommands_Required1Fuzzy_Test
          (ManySubcommands_Required1Fuzzy_Test *this)

{
  (this->super_ManySubcommands).super_TApp.super_Test._vptr_Test = (_func_int **)&PTR__TApp_00177178
  ;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->super_ManySubcommands).super_TApp.args);
  CLI::App::~App(&(this->super_ManySubcommands).super_TApp.app);
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(ManySubcommands, Required1Fuzzy) {

    app.require_subcommand(0, 1);

    run();
    EXPECT_EQ(sub1->remaining(), vs_t({"sub2", "sub3"}));

    app.reset();
    app.require_subcommand(-1);

    run();
    EXPECT_EQ(sub1->remaining(), vs_t({"sub2", "sub3"}));
}